

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pt_pkt_sync_forward(pt_packet_decoder *decoder)

{
  uint8_t *puVar1;
  long lStack_38;
  int errcode;
  ptrdiff_t space;
  uint8_t *begin;
  uint8_t *sync;
  uint8_t *pos;
  pt_packet_decoder *decoder_local;
  
  if (decoder == (pt_packet_decoder *)0x0) {
    decoder_local._4_4_ = -2;
  }
  else {
    puVar1 = (decoder->config).begin;
    begin = decoder->sync;
    sync = decoder->pos;
    if (decoder->pos == (uint8_t *)0x0) {
      sync = puVar1;
    }
    if (sync == begin) {
      sync = sync + 0x10;
    }
    if (sync < puVar1) {
      decoder_local._4_4_ = -1;
    }
    else {
      lStack_38 = (long)sync - (long)puVar1;
      if (0xf < lStack_38) {
        lStack_38 = 0xf;
      }
      sync = sync + -lStack_38;
      pos = (uint8_t *)decoder;
      decoder_local._4_4_ = pt_sync_forward(&begin,sync,&decoder->config);
      if (-1 < decoder_local._4_4_) {
        *(uint8_t **)(pos + 0x120) = begin;
        *(uint8_t **)(pos + 0x118) = begin;
        decoder_local._4_4_ = 0;
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int pt_pkt_sync_forward(struct pt_packet_decoder *decoder)
{
	const uint8_t *pos, *sync, *begin;
	ptrdiff_t space;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	begin = decoder->config.begin;
	sync = decoder->sync;
	pos = decoder->pos;
	if (!pos)
		pos = begin;

	if (pos == sync)
		pos += ptps_psb;

	if (pos < begin)
		return -pte_internal;

	/* Start a bit earlier so we find PSB that have been partially consumed
	 * by a preceding packet.
	 */
	space = pos - begin;
	if (ptps_psb <= space)
		space = ptps_psb - 1;

	pos -= space;

	errcode = pt_sync_forward(&sync, pos, &decoder->config);
	if (errcode < 0)
		return errcode;

	decoder->sync = sync;
	decoder->pos = sync;

	return 0;
}